

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

void __thiscall docopt::Command::Command(Command *this,string *name,value *v)

{
  string sStack_68;
  value local_48;
  
  std::__cxx11::string::string((string *)&sStack_68,(string *)name);
  value::value(&local_48,v);
  Argument::LeafPattern(&this->super_Argument,&sStack_68,&local_48);
  value::~value(&local_48);
  std::__cxx11::string::~string((string *)&sStack_68);
  (this->super_Argument).super_LeafPattern.super_Pattern._vptr_Pattern =
       (_func_int **)&PTR_flat_001d7430;
  return;
}

Assistant:

Command(std::string name, value v = value{false})
		: Argument(std::move(name), std::move(v))
		{}